

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_mb_interp_filter(AV1_COMMON *cm,ThreadData_conflict *td,aom_writer *w)

{
  InterpFilter IVar1;
  int iVar2;
  MACROBLOCKD *xd_00;
  ulong uVar3;
  long in_RSI;
  long in_RDI;
  InterpFilter filter;
  int ctx;
  int dir;
  int_interpfilters filters;
  FRAME_CONTEXT *ec_ctx;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int local_38;
  int in_stack_ffffffffffffffcc;
  aom_writer *w_00;
  long lVar4;
  
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  lVar4 = **(long **)(in_RSI + 0x2058);
  w_00 = *(aom_writer **)(in_RSI + 0x2b38);
  iVar2 = av1_is_interp_needed
                    ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar2 == 0) {
    IVar1 = av1_unswitchable_filter(*(InterpFilter *)(in_RDI + 0x1f9));
    av1_broadcast_interp_filter(IVar1);
  }
  else if (*(char *)(in_RDI + 0x1f9) == '\x04') {
    for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
      iVar2 = av1_get_pred_context_switchable_interp(xd_00,(int)((ulong)lVar4 >> 0x20));
      IVar1 = av1_extract_interp_filter(*(int_interpfilters *)(lVar4 + 0x14),local_38);
      in_stack_ffffffffffffffc0 = CONCAT13(IVar1,(int3)in_stack_ffffffffffffffc0);
      aom_write_symbol(w_00,in_stack_ffffffffffffffcc,
                       (aom_cdf_prob *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
      uVar3 = (ulong)(byte)((uint)in_stack_ffffffffffffffc0 >> 0x18);
      *(int *)(in_RSI + 0x25d60 + uVar3 * 4) = *(int *)(in_RSI + 0x25d60 + uVar3 * 4) + 1;
      if (*(char *)(*(long *)(in_RDI + 0x6088) + 0x40) == '\0') {
        return;
      }
    }
  }
  return;
}

Assistant:

static inline void write_mb_interp_filter(AV1_COMMON *const cm, ThreadData *td,
                                          aom_writer *w) {
  const MACROBLOCKD *xd = &td->mb.e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;

  if (!av1_is_interp_needed(xd)) {
    int_interpfilters filters = av1_broadcast_interp_filter(
        av1_unswitchable_filter(cm->features.interp_filter));
    assert(mbmi->interp_filters.as_int == filters.as_int);
    (void)filters;
    return;
  }
  if (cm->features.interp_filter == SWITCHABLE) {
    int dir;
    for (dir = 0; dir < 2; ++dir) {
      const int ctx = av1_get_pred_context_switchable_interp(xd, dir);
      InterpFilter filter =
          av1_extract_interp_filter(mbmi->interp_filters, dir);
      aom_write_symbol(w, filter, ec_ctx->switchable_interp_cdf[ctx],
                       SWITCHABLE_FILTERS);
      ++td->interp_filter_selected[filter];
      if (cm->seq_params->enable_dual_filter == 0) return;
    }
  }
}